

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O2

NaVector * __thiscall NaVector::scalar_multiply(NaVector *this,NaVector *rVect1,NaVector *rVect2)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined4 *puVar4;
  ulong uVar5;
  
  iVar1 = (*rVect1->_vptr_NaVector[6])(rVect1);
  iVar2 = (*rVect2->_vptr_NaVector[6])(rVect2);
  if (iVar1 == iVar2) {
    uVar3 = (*rVect1->_vptr_NaVector[6])(rVect1);
    (*this->_vptr_NaVector[4])(this,(ulong)uVar3);
    uVar5 = 0;
    while( true ) {
      uVar3 = (*this->_vptr_NaVector[6])(this);
      if (uVar3 <= uVar5) break;
      this->pVect[uVar5] = rVect1->pVect[uVar5] * rVect2->pVect[uVar5];
      uVar5 = uVar5 + 1;
    }
    return this;
  }
  puVar4 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar4 = 2;
  __cxa_throw(puVar4,&NaException::typeinfo,0);
}

Assistant:

NaVector&
NaVector::scalar_multiply (const NaVector& rVect1, const NaVector& rVect2)
{
    if(rVect1.dim() != rVect2.dim())
        throw(na_size_mismatch);

    new_dim(rVect1.dim());

    unsigned    i;
    for(i = 0; i < dim(); ++i)
        pVect[i] = rVect1.pVect[i] * rVect2.pVect[i];

    return *this;
}